

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int add_path(char *path,int l)

{
  uint uVar1;
  int l_local;
  char *path_local;
  
  if (str_offsetCount <= incpathCount) {
    str_offsetCount = str_offsetCount + 0x10;
    str_offset = (int *)realloc(str_offset,(long)str_offsetCount << 2);
    if (str_offset == (int *)0x0) {
      return 0;
    }
  }
  str_offset[incpathCount] = incpathSize - remaining;
  if (remaining < l) {
    uVar1 = incpathSize + l + 0x10U & 0xfffffff0;
    remaining = uVar1 - incpathSize;
    incpathSize = uVar1;
    incpath = (char *)realloc(incpath,(long)(int)uVar1);
    if (incpath == (char *)0x0) {
      return 0;
    }
  }
  remaining = remaining - l;
  strncpy(incpath + str_offset[incpathCount],path,(long)l);
  incpath[str_offset[incpathCount] + l + -1] = '\0';
  incpathCount = incpathCount + 1;
  return 1;
}

Assistant:

int
add_path(char* path, int l)
{
	/* Expand str_offset array if needed */
	if(incpathCount >= str_offsetCount)
	{
		str_offsetCount += INCREMENT_BASE;
		str_offset = (int*)realloc(str_offset, str_offsetCount * sizeof(int));
		if(str_offset == NULL)
			return 0;
	}

	/* Initialize string offset */
	str_offset[incpathCount] = incpathSize - remaining;

	/* Realloc string buffer if needed */
	if(remaining < l)
	{
		remaining  = incpathSize;
		/* evil trick, get the greater multiple of INCREMENT_BASE closer 
		   to (size + l). Note : this only works for INCREMENT_BASE = 2^n*/
		incpathSize = ((incpathSize + l) + INCREMENT_BASE) & ~INCREMENT_BASE_MASK;
		remaining  = incpathSize - remaining;
		incpath = (char*)realloc(incpath, incpathSize);
		if(incpath == NULL)
			return 0;
	}
		
	remaining -= l;

	/* Copy path */
	strncpy(incpath + str_offset[incpathCount], path, l);
	incpath[str_offset[incpathCount] + l - 1] = '\0';
	
	++incpathCount;
	
	return 1;
}